

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waiter.cc
# Opt level: O0

bool __thiscall absl::synchronization_internal::Waiter::Wait(Waiter *this,KernelTimeout t)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  char *absl_raw_logging_internal_basename;
  int local_60;
  int err;
  int32_t x;
  bool first_pass;
  Waiter *this_local;
  KernelTimeout t_local;
  memory_order __b;
  
  bVar1 = true;
  do {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    local_60 = (this->futex_).super___atomic_base<int>._M_i;
    while (local_60 != 0) {
      LOCK();
      iVar2 = (this->futex_).super___atomic_base<int>._M_i;
      bVar4 = local_60 == iVar2;
      if (bVar4) {
        (this->futex_).super___atomic_base<int>._M_i = local_60 + -1;
        iVar2 = local_60;
      }
      UNLOCK();
      local_60 = iVar2;
      if (bVar4) {
        return true;
      }
    }
    if (!bVar1) {
      MaybeBecomeIdle();
    }
    uVar3 = FutexImpl::WaitUntil(&this->futex_,0,t);
    if (((uVar3 != 0) && (uVar3 != 0xfffffffc)) && (uVar3 != 0xfffffff5)) {
      if (uVar3 == 0xffffff92) {
        return false;
      }
      raw_logging_internal::RawLog
                (kFatal,"waiter.cc",100,"Futex operation failed with error %d\n",(ulong)uVar3);
    }
    bVar1 = false;
  } while( true );
}

Assistant:

bool Waiter::Wait(KernelTimeout t) {
  // Loop until we can atomically decrement futex from a positive
  // value, waiting on a futex while we believe it is zero.
  // Note that, since the thread ticker is just reset, we don't need to check
  // whether the thread is idle on the very first pass of the loop.
  bool first_pass = true;

  while (true) {
    int32_t x = futex_.load(std::memory_order_relaxed);
    while (x != 0) {
      if (!futex_.compare_exchange_weak(x, x - 1,
                                        std::memory_order_acquire,
                                        std::memory_order_relaxed)) {
        continue;  // Raced with someone, retry.
      }
      return true;  // Consumed a wakeup, we are done.
    }

    if (!first_pass) MaybeBecomeIdle();
    const int err = Futex::WaitUntil(&futex_, 0, t);
    if (err != 0) {
      if (err == -EINTR || err == -EWOULDBLOCK) {
        // Do nothing, the loop will retry.
      } else if (err == -ETIMEDOUT) {
        return false;
      } else {
        ABSL_RAW_LOG(FATAL, "Futex operation failed with error %d\n", err);
      }
    }
    first_pass = false;
  }
}